

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
               *this,int i)

{
  double *pdVar1;
  Fad<double> *in_RDI;
  value_type vVar2;
  int in_stack_ffffffffffffffdc;
  
  vVar2 = FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          ::fastAccessDx((FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                          *)in_RDI,in_stack_ffffffffffffffdc);
  pdVar1 = Fad<double>::fastAccessDx(in_RDI,in_stack_ffffffffffffffdc);
  return vVar2 - *pdVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) - right_.fastAccessDx(i);}